

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  archive_read *a_00;
  long lVar5;
  int64_t iVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  char *pcVar9;
  size_t sVar10;
  archive_string_conv *paVar11;
  archive_acl *acl;
  int *piVar12;
  wchar_t *pwVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  char *pcVar17;
  void *pvVar18;
  size_t *in_R8;
  ulong uVar19;
  char *pcVar20;
  ssize_t bytes;
  ulong local_38;
  
  sVar10 = *unconsumed;
  do {
    if (sVar10 != 0) {
      __archive_read_consume(a,sVar10);
      *unconsumed = 0;
    }
    pvVar18 = (void *)0x200;
    a_00 = (archive_read *)__archive_read_ahead(a,0x200,(ssize_t *)&local_38);
    if ((long)local_38 < 0) {
      uVar19 = local_38 & 0xffffffff;
      goto LAB_002111ff;
    }
    uVar19 = 1;
    if (local_38 == 0) goto LAB_002111ff;
    if (local_38 < 0x200) {
      archive_set_error(&a->archive,0x54,"Truncated tar archive");
      goto LAB_00210d42;
    }
    *unconsumed = 0x200;
    if ((char)(a_00->archive).magic != '\0') {
LAB_00210b7f:
      wVar2 = checksum(a_00,pvVar18);
      if (wVar2 == L'\0') {
        __archive_read_consume(a,0x200);
        *unconsumed = 0;
        archive_set_error(&a->archive,0x16,"Damaged tar archive");
        uVar19 = 0xfffffff6;
        goto LAB_002111ff;
      }
      iVar3 = tar->header_recursion_depth;
      tar->header_recursion_depth = iVar3 + 1;
      if (0x1f < iVar3) {
        __archive_read_consume(a,0x200);
        *unconsumed = 0;
        pcVar17 = "Too many special headers";
        iVar3 = 0x16;
        goto LAB_00210bc4;
      }
      bVar1 = *(byte *)((long)&a_00->read_data_offset + 4);
      if (bVar1 < 0x56) {
        if (bVar1 == 0x41) {
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "Solaris tar";
          iVar6 = tar_atol(&a_00->field_0x7c,0xc);
          wVar2 = read_body_to_string(a,tar,(archive_string *)a_00,unconsumed,in_R8);
          if ((wVar2 != L'\0') ||
             ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\0' &&
              (wVar2 != L'\xffffffec')))) goto LAB_00210fa3;
          pcVar17 = (tar->acl_text).s;
          cVar15 = *pcVar17;
          if (iVar6 < 1 || cVar15 == '\0') goto LAB_00211101;
          pcVar20 = pcVar17 + iVar6;
          lVar5 = 0;
          goto LAB_00210dd1;
        }
        if (bVar1 == 0x4b) {
          wVar2 = read_body_to_string(a,(tar *)&tar->longlink,(archive_string *)a_00,unconsumed,
                                      in_R8);
          if ((wVar2 != L'\0') ||
             ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\0' &&
              (wVar2 != L'\xffffffec')))) goto LAB_00210fa3;
          archive_entry_copy_link(entry,(tar->longlink).s);
          goto LAB_00210f71;
        }
        if (bVar1 == 0x4c) {
          wVar2 = read_body_to_string(a,(tar *)&tar->longname,(archive_string *)a_00,unconsumed,
                                      in_R8);
          if ((wVar2 != L'\0') ||
             ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\0' &&
              (wVar2 != L'\xffffffec')))) goto LAB_00210fa3;
          wVar4 = _archive_entry_copy_pathname_l
                            (entry,(tar->longname).s,(tar->longname).length,tar->sconv);
          if (wVar4 == L'\0') goto LAB_00210fb2;
          wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
          goto LAB_00210fa3;
        }
      }
      else if (bVar1 < 0x67) {
        if (bVar1 == 0x56) {
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
          goto LAB_00210fa3;
        }
        if (bVar1 == 0x58) {
          (a->archive).archive_format = 0x30002;
          pcVar17 = "POSIX pax interchange format (Sun variant)";
LAB_00210d07:
          (a->archive).archive_format_name = pcVar17;
          wVar2 = header_pax_extensions(a,tar,entry,a_00,unconsumed);
          goto LAB_00210fa3;
        }
      }
      else {
        if (bVar1 == 0x67) {
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "POSIX pax interchange format";
          wVar2 = read_body_to_string(a,(tar *)&tar->pax_global,(archive_string *)a_00,unconsumed,
                                      in_R8);
          if ((wVar2 != L'\0') ||
             (wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\x01')) goto LAB_00210fa3;
          goto LAB_002111ff;
        }
        if (bVar1 == 0x78) {
          (a->archive).archive_format = 0x30002;
          pcVar17 = "POSIX pax interchange format";
          goto LAB_00210d07;
        }
      }
      if (*(long *)((long)&(a_00->client).dataset + 1) == 0x20207261747375) {
        (a->archive).archive_format = 0x30004;
        (a->archive).archive_format_name = "GNU tar format";
        wVar2 = header_gnutar(a,tar,entry,a_00,unconsumed);
      }
      else if (*(char *)((long)&(a_00->client).dataset + 5) == 'r' &&
               *(int *)((long)&(a_00->client).dataset + 1) == 0x61747375) {
        if ((a->archive).archive_format != 0x30002) {
          (a->archive).archive_format = 0x30001;
          (a->archive).archive_format_name = "POSIX ustar format";
        }
        wVar2 = header_ustar(a,tar,entry,a_00);
      }
      else {
        (a->archive).archive_format = 0x30000;
        (a->archive).archive_format_name = "tar (non-POSIX)";
        wVar2 = header_old_tar(a,tar,entry,a_00);
      }
      goto LAB_00210fa3;
    }
    lVar5 = 1;
    while ((int)lVar5 != 0x200) {
      pcVar17 = (char *)((long)&(a_00->archive).magic + lVar5);
      lVar5 = lVar5 + 1;
      if (*pcVar17 != '\0') goto LAB_00210b7f;
    }
    if ((a->archive).archive_format_name == (char *)0x0) {
      (a->archive).archive_format = 0x30000;
      (a->archive).archive_format_name = "tar";
    }
    sVar10 = 0x200;
  } while (tar->read_concatenated_archives != 0);
  __archive_read_consume(a,0x200);
  *unconsumed = 0;
  pcVar17 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if ((pcVar17 != (char *)0x0) && (*pcVar17 == '\0')) {
    lVar5 = 1;
    do {
      if ((int)lVar5 == 0x200) {
        __archive_read_consume(a,0x200);
        break;
      }
      pcVar20 = pcVar17 + lVar5;
      lVar5 = lVar5 + 1;
    } while (*pcVar20 == '\0');
  }
  archive_clear_error(&a->archive);
  goto LAB_002111ff;
  while( true ) {
    pcVar17 = pcVar9 + 1;
    cVar15 = pcVar9[1];
    if ((cVar15 == '\0') || (pcVar20 <= pcVar17)) break;
LAB_00210dd1:
    pcVar9 = pcVar17;
    if ((byte)(cVar15 - 0x38U) < 0xf8) {
      pcVar17 = "Malformed Solaris ACL attribute (invalid digit)";
      goto LAB_0021114a;
    }
    lVar5 = (ulong)(byte)(cVar15 - 0x30) + lVar5 * 8;
    if (0xffffff < lVar5) {
      pcVar17 = "Malformed Solaris ACL attribute (count too large)";
      goto LAB_0021114a;
    }
  }
  uVar16 = (uint)lVar5 & 0xfffc0000;
  if (uVar16 == 0x40000) {
    if (pcVar20 <= pcVar9 + 2) {
      pcVar17 = "Malformed Solaris ACL attribute (body overflow)";
      goto LAB_0021114a;
    }
    lVar5 = 1;
    do {
      lVar14 = lVar5;
      if (pcVar17[lVar14] == '\0') break;
      lVar5 = lVar14 + 1;
    } while (pcVar17 + lVar14 < pcVar20);
    if (tar->sconv_acl == (archive_string_conv *)0x0) {
      paVar11 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      tar->sconv_acl = paVar11;
      if (paVar11 == (archive_string_conv *)0x0) {
LAB_00210d42:
        uVar19 = 0xffffffe2;
        goto LAB_002111ff;
      }
    }
    (tar->localname).length = 0;
    archive_strncat(&tar->localname,pcVar9 + 2,lVar14 - 1);
    acl = archive_entry_acl(entry);
    wVar2 = archive_acl_parse_l(acl,(tar->localname).s,L'Ā',tar->sconv_acl);
    if (wVar2 == L'\0') {
LAB_00210f71:
      wVar2 = L'\0';
    }
    else {
      piVar12 = __errno_location();
      if (*piVar12 == 0xc) {
        pcVar17 = "Can\'t allocate memory for ACL";
        iVar3 = 0xc;
      }
      else {
        pcVar17 = "Malformed Solaris ACL attribute (unparsable)";
        iVar3 = -1;
      }
      archive_set_error(&a->archive,iVar3,pcVar17);
LAB_00210fa3:
      uVar19 = 0xffffffe2;
      if (wVar2 == L'\xffffffe2') goto LAB_002111ff;
    }
  }
  else {
    if (uVar16 == 0xc0000) {
      pcVar17 = "Solaris NFSv4 ACLs not supported";
LAB_0021114a:
      archive_set_error(&a->archive,-1,pcVar17);
    }
    else {
LAB_00211101:
      archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %o)");
    }
    wVar2 = L'\xffffffec';
  }
LAB_00210fb2:
  if (*unconsumed != 0) {
    __archive_read_consume(a,*unconsumed);
    *unconsumed = 0;
  }
  iVar3 = tar->header_recursion_depth + -1;
  tar->header_recursion_depth = iVar3;
  if ((((wVar2 == L'\0') || (wVar2 == L'\xffffffec')) && (iVar3 == 0)) &&
     (tar->process_mac_extensions != 0)) {
    pwVar7 = archive_entry_pathname_w(entry);
    pwVar13 = pwVar7;
    if (pwVar7 == (wchar_t *)0x0) {
      pcVar17 = archive_entry_pathname(entry);
      pcVar20 = pcVar17;
      if (pcVar17 == (char *)0x0) {
        wVar4 = L'\xffffffe7';
      }
      else {
        do {
          while( true ) {
            pcVar9 = pcVar17 + 1;
            cVar15 = *pcVar17;
            pcVar17 = pcVar9;
            if (cVar15 != '/') break;
            if (*pcVar9 != '\0') {
              pcVar20 = pcVar9;
            }
          }
        } while (cVar15 != '\0');
        wVar4 = L'\0';
        if (((*pcVar20 == '.') && (pcVar20[1] == '_')) && (pcVar20[2] != '\0')) goto LAB_00211095;
      }
    }
    else {
      do {
        while( true ) {
          pwVar8 = pwVar7 + 1;
          wVar4 = *pwVar7;
          pwVar7 = pwVar8;
          if (wVar4 != L'/') break;
          if (*pwVar8 != L'\0') {
            pwVar13 = pwVar8;
          }
        }
      } while (wVar4 != L'\0');
      wVar4 = L'\0';
      if (((*pwVar13 == L'.') && (wVar4 = L'\0', pwVar13[1] == L'_')) && (pwVar13[2] != L'\0')) {
LAB_00211095:
        sVar10 = archive_entry_size(entry);
        pvVar18 = __archive_read_ahead(a,sVar10,(ssize_t *)0x0);
        if (pvVar18 == (void *)0x0) {
          *unconsumed = 0;
          wVar4 = L'\xffffffe2';
        }
        else {
          archive_entry_copy_mac_metadata(entry,pvVar18,sVar10);
          uVar19 = sVar10 + 0x1ff & 0xfffffffffffffe00;
          *unconsumed = uVar19;
          if (uVar19 != 0) {
            __archive_read_consume(a,uVar19);
            *unconsumed = 0;
          }
          wVar4 = tar_read_header(a,tar,entry,unconsumed);
        }
      }
    }
    if (wVar4 < wVar2) {
      wVar2 = wVar4;
    }
  }
  if (wVar2 != L'\xffffffec') {
    uVar19 = 0xffffffe2;
    if (wVar2 == L'\x01') {
      archive_set_error(&a->archive,0x16,"Damaged tar archive");
      goto LAB_002111ff;
    }
    if (wVar2 != L'\0') goto LAB_002111ff;
  }
  if (tar->sparse_gnu_pending != '\0') {
    if ((tar->sparse_gnu_major != 1) || (tar->sparse_gnu_minor != 0)) {
      pcVar17 = "Unrecognized GNU sparse file format";
      iVar3 = -1;
LAB_00210bc4:
      archive_set_error(&a->archive,iVar3,pcVar17);
      uVar19 = 0xffffffec;
      goto LAB_002111ff;
    }
    tar->sparse_gnu_pending = '\0';
    uVar19 = gnu_sparse_10_read(a,tar,unconsumed);
    tar->entry_bytes_remaining = tar->entry_bytes_remaining - uVar19;
    if ((long)uVar19 < 0) goto LAB_002111ff;
    tar->sparse_gnu_pending = '\0';
  }
  uVar19 = (ulong)(uint)wVar2;
LAB_002111ff:
  return (wchar_t)uVar19;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err;
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Loop until we find a workable header record. */
	for (;;) {
		tar_flush_unconsumed(a, unconsumed);

		/* Read 512-byte header record */
		h = __archive_read_ahead(a, 512, &bytes);
		if (bytes < 0)
			return ((int)bytes);
		if (bytes == 0) { /* EOF at a block boundary. */
			/* Some writers do omit the block of nulls. <sigh> */
			return (ARCHIVE_EOF);
		}
		if (bytes < 512) {  /* Short block at EOF; this is bad. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;

		/* Header is workable if it's not an end-of-archive mark. */
		if (h[0] != 0 || !archive_block_is_null(h))
			break;

		/* Ensure format is set for archives with only null blocks. */
		if (a->archive.archive_format_name == NULL) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar";
		}

		if (!tar->read_concatenated_archives) {
			/* Try to consume a second all-null record, as well. */
			tar_flush_unconsumed(a, unconsumed);
			h = __archive_read_ahead(a, 512, NULL);
			if (h != NULL && h[0] == 0 && archive_block_is_null(h))
				__archive_read_consume(a, 512);
			archive_clear_error(&a->archive);
			return (ARCHIVE_EOF);
		}

		/*
		 * We're reading concatenated archives, ignore this block and
		 * loop to get the next.
		 */
	}

	/*
	 * Note: If the checksum fails and we return ARCHIVE_RETRY,
	 * then the client is likely to just retry.  This is a very
	 * crude way to search for the next valid header!
	 *
	 * TODO: Improve this by implementing a real header scan.
	 */
	if (!checksum(a, h)) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
		return (ARCHIVE_RETRY); /* Retryable: Invalid header */
	}

	if (++tar->header_recursion_depth > 32) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Too many special headers");
		return (ARCHIVE_WARN);
	}

	/* Determine the format variant. */
	header = (const struct archive_entry_header_ustar *)h;

	switch(header->typeflag[0]) {
	case 'A': /* Solaris tar ACL */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "Solaris tar";
		err = header_Solaris_ACL(a, tar, entry, h, unconsumed);
		break;
	case 'g': /* POSIX-standard 'g' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_global(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			return (err);
		break;
	case 'K': /* Long link name (GNU tar, others) */
		err = header_longlink(a, tar, entry, h, unconsumed);
		break;
	case 'L': /* Long filename (GNU tar, others) */
		err = header_longname(a, tar, entry, h, unconsumed);
		break;
	case 'V': /* GNU volume header */
		err = header_volume(a, tar, entry, h, unconsumed);
		break;
	case 'X': /* Used by SUN tar; same as 'x'. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name =
		    "POSIX pax interchange format (Sun variant)";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	case 'x': /* POSIX-standard 'x' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	default:
		gnuheader = (const struct archive_entry_header_gnutar *)h;
		if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
			a->archive.archive_format_name = "GNU tar format";
			err = header_gnutar(a, tar, entry, h, unconsumed);
		} else if (memcmp(header->magic, "ustar", 5) == 0) {
			if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
				a->archive.archive_format_name = "POSIX ustar format";
			}
			err = header_ustar(a, tar, entry, h);
		} else {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar (non-POSIX)";
			err = header_old_tar(a, tar, entry, h);
		}
	}
	if (err == ARCHIVE_FATAL)
		return (err);

	tar_flush_unconsumed(a, unconsumed);

	h = NULL;
	header = NULL;

	--tar->header_recursion_depth;
	/* Yuck.  Apple's design here ends up storing long pathname
	 * extensions for both the AppleDouble extension entry and the
	 * regular entry.
	 */
	if ((err == ARCHIVE_WARN || err == ARCHIVE_OK) &&
	    tar->header_recursion_depth == 0 &&
	    tar->process_mac_extensions) {
		int err2 = read_mac_metadata_blob(a, tar, entry, h, unconsumed);
		if (err2 < err)
			err = err2;
	}

	/* We return warnings or success as-is.  Anything else is fatal. */
	if (err == ARCHIVE_WARN || err == ARCHIVE_OK) {
		if (tar->sparse_gnu_pending) {
			if (tar->sparse_gnu_major == 1 &&
			    tar->sparse_gnu_minor == 0) {
				ssize_t bytes_read;

				tar->sparse_gnu_pending = 0;
				/* Read initial sparse map. */
				bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
				tar->entry_bytes_remaining -= bytes_read;
				if (bytes_read < 0)
					return ((int)bytes_read);
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unrecognized GNU sparse file format");
				return (ARCHIVE_WARN);
			}
			tar->sparse_gnu_pending = 0;
		}
		return (err);
	}
	if (err == ARCHIVE_EOF)
		/* EOF when recursively reading a header is bad. */
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
	return (ARCHIVE_FATAL);
}